

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMT_RSA_DECRYPT_Unmarshal(TPMT_RSA_DECRYPT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMT_RSA_DECRYPT *target_local;
  
  target_local._4_4_ = TPMI_ALG_RSA_DECRYPT_Unmarshal(&target->scheme,buffer,size,flag);
  if (target_local._4_4_ == 0) {
    target_local._4_4_ =
         TPMU_ASYM_SCHEME_Unmarshal(&target->details,buffer,size,(uint)target->scheme);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMT_RSA_DECRYPT_Unmarshal(TPMT_RSA_DECRYPT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPMI_ALG_RSA_DECRYPT_Unmarshal((TPMI_ALG_RSA_DECRYPT *)&(target->scheme), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_ASYM_SCHEME_Unmarshal((TPMU_ASYM_SCHEME *)&(target->details), buffer, size, (UINT32)target->scheme);
    return result;
}